

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_sectors.cxx
# Opt level: O1

void __thiscall
xray_re::xr_level_sectors::load(xr_level_sectors *this,uint32_t xrlc_version,xr_reader *r)

{
  xr_reader *r_00;
  xr_reader *local_18;
  
  local_18 = (xr_reader *)0x0;
  if (xrlc_version < 10) {
    local_18 = xr_reader::open_chunk(r,xrlc_version == 5 | 10);
    if (local_18 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_sectors.cxx"
                    ,0x35,"void xray_re::xr_level_sectors::load(uint32_t, xr_reader &)");
    }
    load_v5(this,local_18);
  }
  else {
    r_00 = xr_reader::open_chunk(r,8);
    if (r_00 == (xr_reader *)0x0) {
      __assert_fail("s",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_sectors.cxx"
                    ,0x39,"void xray_re::xr_level_sectors::load(uint32_t, xr_reader &)");
    }
    load_v13(this,r_00);
  }
  xr_reader::close_chunk(r,&local_18);
  return;
}

Assistant:

void xr_level_sectors::load(uint32_t xrlc_version, xr_reader& r)
{
	xr_reader* s = 0;
	if (xrlc_version <= XRLC_VERSION_9) {
		if (xrlc_version == XRLC_VERSION_5)
			s = r.open_chunk(FSL5_SECTORS);
		else
			s = r.open_chunk(FSL8_SECTORS);
		xr_assert(s);
		load_v5(*s);
	} else {
		xr_reader* s = r.open_chunk(FSL13_SECTORS);
		xr_assert(s);
		load_v13(*s);
	}
	r.close_chunk(s);
}